

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O2

int __thiscall
llvm::DWARFExpression::Operation::verify
          (Operation *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Encoding EVar1;
  Tag TVar2;
  undefined8 in_RAX;
  undefined6 extraout_var;
  long lVar3;
  undefined1 local_38 [8];
  DWARFDie Die;
  
  lVar3 = 2;
  do {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    if (lVar3 == 4) {
      return (int)in_RAX;
    }
    EVar1 = (this->Desc).Op[lVar3 + -2];
    if (EVar1 == BaseTypeRef) {
      _local_38 = DWARFUnit::getDIEForOffset
                            ((DWARFUnit *)ctx,
                             *(long *)((long)&this->Desc + lVar3 * 8 + -1) + *(long *)(ctx + 0x18));
      if ((local_38 == (DWARFUnit *)0x0) || (local_38._8_8_ == (DWARFDebugInfoEntry *)0x0)) {
LAB_00d9aab6:
        this->Error = true;
        return 0;
      }
      TVar2 = DWARFDie::getTag((DWARFDie *)local_38);
      in_RAX = CONCAT62(extraout_var,TVar2);
      if (TVar2 != DW_TAG_base_type) goto LAB_00d9aab6;
    }
    else if (EVar1 == SizeNA) {
      return (int)in_RAX;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool DWARFExpression::Operation::verify(DWARFUnit *U) {

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (!Die || Die.getTag() != dwarf::DW_TAG_base_type) {
        Error = true;
        return false;
      }
    }
  }

  return true;
}